

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O0

void __thiscall
MxxColl_ScattervGeneral_Test::~MxxColl_ScattervGeneral_Test(MxxColl_ScattervGeneral_Test *this)

{
  MxxColl_ScattervGeneral_Test *this_local;
  
  ~MxxColl_ScattervGeneral_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MxxColl, ScattervGeneral) {
    mxx::comm c = MPI_COMM_WORLD;

    std::vector<int> vec;
    std::vector<size_t> sizes;

    // scatter from 0
    if (c.rank() == 0) {
        sizes.resize(c.size());
        for (int i = 0; i < c.size(); ++i) {
            sizes[i] = i+1;
            for (size_t j = 0; j < (size_t)(i+1); ++j)
            {
                vec.push_back(2*j + 3*i);
            }
        }
    }

    // test general case
    std::vector<int> result(c.rank()+1);
    mxx::scatterv(&vec[0], sizes, &result.front(), c.rank()+1, 0, c);
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(2*j+3*c.rank(), result[j]);
    }
}